

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasFoodWeb_bnd.c
# Opt level: O0

int resweb(sunrealtype tt,N_Vector cc,N_Vector cp,N_Vector res,void *user_data)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  UserData webdata;
  sunrealtype *cpv;
  sunrealtype *resv;
  sunindextype np;
  sunindextype loc;
  sunindextype yloc;
  sunindextype is;
  sunindextype jy;
  sunindextype jx;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  lVar2 = N_VGetArrayPointer(in_RSI);
  lVar3 = N_VGetArrayPointer(in_RDX);
  lVar1 = *(long *)(in_RCX + 0x10);
  Fweb((sunrealtype)np,(N_Vector)resv,(N_Vector)cpv,webdata);
  for (local_38 = 0; local_38 < 0x14; local_38 = local_38 + 1) {
    for (local_30 = 0; local_30 < 0x14; local_30 = local_30 + 1) {
      lVar4 = local_38 * 0x28 + local_30 * 2;
      for (local_40 = 0; local_40 < 2; local_40 = local_40 + 1) {
        if (local_40 < lVar1) {
          *(double *)(lVar3 + (lVar4 + local_40) * 8) =
               *(double *)(lVar2 + (lVar4 + local_40) * 8) -
               *(double *)(lVar3 + (lVar4 + local_40) * 8);
        }
        else {
          *(ulong *)(lVar3 + (lVar4 + local_40) * 8) =
               *(ulong *)(lVar3 + (lVar4 + local_40) * 8) ^ 0x8000000000000000;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int resweb(sunrealtype tt, N_Vector cc, N_Vector cp, N_Vector res,
                  void* user_data)
{
  sunindextype jx, jy, is, yloc, loc, np;
  sunrealtype *resv, *cpv;
  UserData webdata;

  webdata = (UserData)user_data;

  cpv  = N_VGetArrayPointer(cp);
  resv = N_VGetArrayPointer(res);
  np   = webdata->np;

  /* Call Fweb to set res to vector of right-hand sides. */
  Fweb(tt, cc, res, webdata);

  /* Loop over all grid points, setting residual values appropriately
     for differential or algebraic components.                        */

  for (jy = 0; jy < MY; jy++)
  {
    yloc = NSMX * jy;
    for (jx = 0; jx < MX; jx++)
    {
      loc = yloc + NUM_SPECIES * jx;
      for (is = 0; is < NUM_SPECIES; is++)
      {
        if (is < np) { resv[loc + is] = cpv[loc + is] - resv[loc + is]; }
        else { resv[loc + is] = -resv[loc + is]; }
      }
    }
  }

  return (0);
}